

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::RepeatedPtrFieldIteratorTest_Comparable_Test::
RepeatedPtrFieldIteratorTest_Comparable_Test(RepeatedPtrFieldIteratorTest_Comparable_Test *this)

{
  RepeatedPtrFieldIteratorTest_Comparable_Test *this_local;
  
  RepeatedPtrFieldIteratorTest::RepeatedPtrFieldIteratorTest
            (&this->super_RepeatedPtrFieldIteratorTest);
  (this->super_RepeatedPtrFieldIteratorTest).super_Test._vptr_Test =
       (_func_int **)&PTR__RepeatedPtrFieldIteratorTest_Comparable_Test_029eb4e0;
  return;
}

Assistant:

TEST_F(RepeatedPtrFieldIteratorTest, Comparable) {
  RepeatedPtrField<std::string>::const_iterator iter = proto_array_.begin();
  RepeatedPtrField<std::string>::const_iterator iter2 = iter + 1;
  EXPECT_TRUE(iter == iter);
  EXPECT_TRUE(iter != iter2);
  EXPECT_TRUE(iter < iter2);
  EXPECT_TRUE(iter <= iter2);
  EXPECT_TRUE(iter <= iter);
  EXPECT_TRUE(iter2 > iter);
  EXPECT_TRUE(iter2 >= iter);
  EXPECT_TRUE(iter >= iter);
}